

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O1

int ddSymmSiftingBackward(DdManager *table,Move *moves,int size)

{
  Move **ppMVar1;
  uint x;
  uint uVar2;
  DdSubtable *pDVar3;
  int iVar4;
  uint x_00;
  uint uVar5;
  uint uVar6;
  Move *pMVar7;
  uint *puVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  
  pMVar7 = moves;
  if (moves != (Move *)0x0) {
    do {
      if (pMVar7->size < size) {
        size = pMVar7->size;
      }
      ppMVar1 = &pMVar7->next;
      pMVar7 = *ppMVar1;
    } while (*ppMVar1 != (Move *)0x0);
  }
  if (moves != (Move *)0x0) {
    do {
      if (moves->size == size) {
        return 1;
      }
      pDVar3 = table->subtables;
      x = moves->x;
      if ((pDVar3[x].next == x) && (uVar6 = moves->y, pDVar3[uVar6].next == uVar6)) {
        iVar4 = cuddSwapInPlace(table,x,uVar6);
      }
      else {
        uVar6 = moves->y;
        uVar2 = pDVar3[(int)x].next;
        uVar10 = uVar6;
        do {
          uVar5 = uVar10;
          uVar10 = pDVar3[(int)uVar5].next;
        } while (uVar5 < pDVar3[(int)uVar5].next);
        iVar11 = x - uVar2;
        iVar13 = uVar5 - uVar6;
        if (iVar13 < 0) {
          iVar4 = -1;
        }
        else {
          iVar4 = -1;
          uVar5 = x;
          iVar12 = 1;
          uVar10 = uVar6;
          do {
            iVar9 = iVar11 + 1;
            if (-1 < iVar11) {
              do {
                x_00 = uVar5;
                iVar4 = cuddSwapInPlace(table,x_00,uVar10);
                if (iVar4 == 0) {
                  iVar4 = 0;
                  goto LAB_00795228;
                }
                uVar5 = cuddNextLow(table,x_00);
                iVar9 = iVar9 + -1;
                uVar10 = x_00;
              } while (iVar9 != 0);
            }
            uVar10 = iVar12 + uVar6;
            uVar5 = (iVar12 + uVar6) - 1;
            bVar14 = iVar12 != iVar13 + 1;
            iVar12 = iVar12 + 1;
          } while (bVar14);
        }
        uVar6 = uVar2;
        if (0 < iVar13) {
          puVar8 = &table->subtables[(int)uVar2].next;
          do {
            uVar6 = uVar6 + 1;
            *puVar8 = uVar6;
            puVar8 = puVar8 + 0xe;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        pDVar3 = table->subtables;
        pDVar3[(int)uVar6].next = uVar2;
        uVar5 = uVar6 + 1;
        uVar10 = uVar5;
        if (0 < iVar11) {
          puVar8 = &pDVar3[(int)uVar5].next;
          uVar6 = uVar6 + 2;
          iVar11 = 0;
          do {
            *puVar8 = uVar6;
            puVar8 = puVar8 + 0xe;
            iVar11 = iVar11 + -1;
            uVar6 = uVar6 + 1;
          } while (uVar2 - x != iVar11);
          uVar10 = uVar5 - iVar11;
        }
        pDVar3[(int)uVar10].next = uVar5;
      }
LAB_00795228:
      if (iVar4 == 0) {
        return 0;
      }
      moves = moves->next;
    } while (moves != (Move *)0x0);
  }
  return 1;
}

Assistant:

static int
ddSymmSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res = -1;

    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (table->subtables[move->x].next == move->x && table->subtables[move->y].next == move->y) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
#ifdef DD_DEBUG
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = ddSymmGroupMoveBackward(table,(int)move->x,(int)move->y);
        }
        if (!res) return(0);
    }

    return(1);

}